

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

int text_click(t_gobj *z,_glist *glist,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  byte bVar1;
  t_symbol *s;
  t_gotfn p_Var2;
  int iVar3;
  t_floatarg in_XMM0_Da;
  t_floatarg in_XMM1_Da;
  t_floatarg in_XMM2_Da;
  t_floatarg in_XMM3_Da;
  t_floatarg in_XMM4_Da;
  
  bVar1 = *(byte *)((long)&z[2].g_next + 6) & 3;
  if (bVar1 == 2) {
    iVar3 = 1;
    if (doit != 0) {
      message_click((t_message *)z,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,in_XMM3_Da,in_XMM4_Da);
    }
  }
  else {
    iVar3 = 0;
    if (bVar1 == 1) {
      s = gensym("click");
      p_Var2 = zgetfn(&z->g_pd,s);
      iVar3 = 0;
      if ((p_Var2 != (t_gotfn)0x0) && (iVar3 = 1, doit != 0)) {
        pd_vmess(&z->g_pd,s,"fffff",(double)xpix,(double)ypix,(double)shift,0,(double)alt);
      }
    }
  }
  return iVar3;
}

Assistant:

static int text_click(t_gobj *z, struct _glist *glist,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_text *x = (t_text *)z;
    if (x->te_type == T_OBJECT)
    {
        t_symbol *clicksym = gensym("click");
        if (zgetfn(&x->te_pd, clicksym))
        {
            if (doit)
                pd_vmess(&x->te_pd, clicksym, "fffff",
                    (double)xpix, (double)ypix,
                        (double)shift, (double)0, (double)alt);
            return (1);
        }
        else return (0);
    }
    else if (x->te_type == T_MESSAGE)
    {
        if (doit)
            message_click((t_message *)x, (t_floatarg)xpix, (t_floatarg)ypix,
                (t_floatarg)shift, (t_floatarg)0, (t_floatarg)alt);
        return (1);
    }
    else return (0);
}